

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discover.cc
# Opt level: O2

bool __thiscall
rcdiscover::Discover::getResponse
          (Discover *this,
          vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> *info,
          int timeout_per_socket)

{
  pointer pSVar1;
  pointer pfVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result<rcdiscover::DeviceInfo> *p_Var4;
  bool bVar5;
  _State_baseV2 *__tmp_1;
  _State_baseV2 *__tmp;
  pointer pSVar6;
  pointer this_00;
  __allocator_type __a2;
  __state_type local_1b8;
  __allocator_type __a2_1;
  thread local_190;
  undefined8 local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_180;
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  futures;
  __basic_future<rcdiscover::DeviceInfo> local_158;
  timeval tv;
  DeviceInfo local_138;
  
  tv.tv_sec = (__time_t)(timeout_per_socket / 1000);
  tv.tv_usec = (__suseconds_t)((timeout_per_socket % 1000) * 1000);
  futures.
  super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  futures.
  super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  futures.
  super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar1 = (this->sockets_).
           super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar6 = (this->sockets_).
                super__Vector_base<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pfVar2 = futures.
               super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, pSVar6 != pSVar1; pSVar6 = pSVar6 + 1) {
    local_1b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_1b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
    local_138.iface_name._M_dataplus._M_p = (pointer)&__a2;
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00120a28;
    p_Var3[1]._M_use_count = 0;
    p_Var3[1]._M_weak_count = 0;
    *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
    *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
    p_Var3[2]._M_use_count = 0;
    p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var3[3]._M_use_count = 0;
    p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00120a78;
    local_138.iface_name._M_string_length = (size_type)p_Var3;
    p_Var4 = (_Result<rcdiscover::DeviceInfo> *)operator_new(0x118);
    std::__future_base::_Result<rcdiscover::DeviceInfo>::_Result(p_Var4);
    p_Var3[4]._vptr__Sp_counted_base = (_func_int **)p_Var4;
    *(pointer *)&p_Var3[4]._M_use_count = pSVar6;
    p_Var3[5]._vptr__Sp_counted_base = (_func_int **)&tv;
    *(vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
      **)&p_Var3[5]._M_use_count = &this->req_nums_;
    local_190._M_id._M_thread = (id)0;
    ___a2_1 = (long *)operator_new(0x20);
    *___a2_1 = (long)&PTR___State_00120ad0;
    ___a2_1[1] = (long)(p_Var3 + 1);
    ___a2_1[2] = (long)std::__future_base::
                       _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rcdiscover/rcdiscover/discover.cc:123:54)>_>,_rcdiscover::DeviceInfo>
                       ::_M_run;
    ___a2_1[3] = 0;
    std::thread::_M_start_thread(&local_190,&__a2_1,0);
    if (___a2_1 != (long *)0x0) {
      (**(code **)(*___a2_1 + 8))();
    }
    std::thread::operator=((thread *)(p_Var3 + 3),&local_190);
    std::thread::~thread(&local_190);
    local_138.iface_name._M_string_length = 0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rcdiscover/rcdiscover/discover.cc:123:54)>_>,_rcdiscover::DeviceInfo>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rcdiscover/rcdiscover/discover.cc:123:54)>_>,_rcdiscover::DeviceInfo>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_roboception[P]rcdiscover_rcdiscover_discover_cc:123:54)>_>,_rcdiscover::DeviceInfo>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_roboception[P]rcdiscover_rcdiscover_discover_cc:123:54)>_>,_rcdiscover::DeviceInfo>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&local_138);
    local_188 = 0;
    _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_138.iface_name._M_dataplus._M_p =
         (pointer)local_1b8.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
    local_138.iface_name._M_string_length =
         (size_type)
         local_1b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var3 + 1);
    local_1b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138.iface_name._M_string_length)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_180);
    if (local_1b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      local_138.iface_name._M_dataplus._M_p = (pointer)&__a2_1;
      p_Var3->_M_use_count = 1;
      p_Var3->_M_weak_count = 1;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00120b10;
      p_Var3[1]._M_use_count = 0;
      p_Var3[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var3[2]._M_use_count = 0;
      p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00120b60;
      local_138.iface_name._M_string_length = (size_type)p_Var3;
      p_Var4 = (_Result<rcdiscover::DeviceInfo> *)operator_new(0x118);
      std::__future_base::_Result<rcdiscover::DeviceInfo>::_Result(p_Var4);
      p_Var3[3]._vptr__Sp_counted_base = (_func_int **)p_Var4;
      *(pointer *)&p_Var3[3]._M_use_count = pSVar6;
      p_Var3[4]._vptr__Sp_counted_base = (_func_int **)&tv;
      *(vector<std::tuple<unsigned_char,_unsigned_char>,_std::allocator<std::tuple<unsigned_char,_unsigned_char>_>_>
        **)&p_Var3[4]._M_use_count = &this->req_nums_;
      local_138.iface_name._M_string_length = 0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rcdiscover/rcdiscover/discover.cc:123:54)>_>,_rcdiscover::DeviceInfo>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rcdiscover/rcdiscover/discover.cc:123:54)>_>,_rcdiscover::DeviceInfo>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_roboception[P]rcdiscover_rcdiscover_discover_cc:123:54)>_>,_rcdiscover::DeviceInfo>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_roboception[P]rcdiscover_rcdiscover_discover_cc:123:54)>_>,_rcdiscover::DeviceInfo>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_138);
      local_188 = 0;
      _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_138.iface_name._M_dataplus._M_p =
           (pointer)local_1b8.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      local_138.iface_name._M_string_length =
           (size_type)
           local_1b8.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_1b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var3 + 1);
      local_1b8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_138.iface_name._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_180);
    }
    std::__basic_future<rcdiscover::DeviceInfo>::__basic_future(&local_158,&local_1b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1b8.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    vector<std::future<rcdiscover::DeviceInfo>,std::allocator<std::future<rcdiscover::DeviceInfo>>>
    ::emplace_back<std::future<rcdiscover::DeviceInfo>>
              ((vector<std::future<rcdiscover::DeviceInfo>,std::allocator<std::future<rcdiscover::DeviceInfo>>>
                *)&futures,(future<rcdiscover::DeviceInfo> *)&local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_158._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  bVar5 = false;
  for (this_00 = futures.
                 super__Vector_base<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pfVar2; this_00 = this_00 + 1
      ) {
    std::future<rcdiscover::DeviceInfo>::get(&local_138,this_00);
    std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::
    emplace_back<rcdiscover::DeviceInfo>(info,&local_138);
    DeviceInfo::~DeviceInfo(&local_138);
    bVar5 = (bool)(bVar5 | (info->
                           super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                           )._M_impl.super__Vector_impl_data._M_finish[-1].mac != 0);
  }
  std::
  vector<std::future<rcdiscover::DeviceInfo>,_std::allocator<std::future<rcdiscover::DeviceInfo>_>_>
  ::~vector(&futures);
  return bVar5;
}

Assistant:

bool Discover::getResponse(std::vector<DeviceInfo> &info,
                           int timeout_per_socket)
{
  // setup waiting for data to arrive

  struct timeval tv;
  tv.tv_sec=timeout_per_socket/1000;
  tv.tv_usec=(timeout_per_socket%1000)*1000;

  // try to get a valid package (repeat if an invalid package is received)

  const auto &req_nums = req_nums_;

  std::vector<std::future<DeviceInfo>> futures;
  for (auto &socket : sockets_)
  {
    futures.push_back(std::async(std::launch::async, [&socket, &tv, &req_nums]
    {
      DeviceInfo device_info(socket.getIfaceName());
      device_info.clear();

      int count = 10;

      auto sock = socket.getHandle<typename SocketType::SocketType>();

      fd_set fds;
      FD_ZERO(&fds);
      FD_SET(sock, &fds);

      while (!device_info.isValid() && count > 0)
      {
        count--;

        if (select(static_cast<int>(sock+1), &fds, NULL, NULL, &tv) > 0)
        {
          // get package

          uint8_t p[600];

          struct sockaddr_in addr;
#ifdef WIN32
          int naddr = sizeof(addr);
#else
          socklen_t naddr = sizeof(addr);
#endif
          memset(&addr, 0, naddr);

          long n = recvfrom(sock,
                            reinterpret_cast<char *>(p), sizeof(p), 0,
                            reinterpret_cast<struct sockaddr *>(&addr), &naddr);

          // check if received package is a valid discovery acknowledge

          if (n >= 8)
          {
            if (p[0] == 0 && p[1] == 0 && p[2] == 0 &&
                p[3] == 0x03)
            {
              if (std::find(req_nums.begin(), req_nums.end(),
                            std::make_tuple(p[6], p[7])) != req_nums.end())
              {
                size_t len=(static_cast<size_t>(p[4])<<8)|p[5];

                if (static_cast<size_t>(n) >= len+8)
                {
                  // extract information and store in list

                  device_info.set(p+8, len);
                }
              }
            }
          }
        }
        else
        {
          count=0;
        }
      }

      return device_info;
    }));

  }

  bool ret = false;
  for (auto &f : futures)
  {
    info.push_back(f.get());
    ret |= info.back().isValid();
  }

  return ret;
}